

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

char * CVmObjString::reflect_to_str
                 (vm_val_t *new_str,char *result_buf,size_t result_buf_size,vm_val_t *val,char *fmt,
                 ...)

{
  char in_AL;
  char *pcVar1;
  vm_val_t *pvVar2;
  vm_val_t *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qb;
  vm_val_t *in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  vm_val_t *in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  CVmRun *in_XMM3_Qa;
  vm_rcdesc *in_XMM4_Qb;
  size_t need;
  va_list args;
  char *str;
  vm_prop_id_t valToSym;
  vm_val_t refl;
  vm_val_t *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  vm_val_t *in_stack_fffffffffffffee8;
  undefined8 in_stack_ffffffffffffff10;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  vm_prop_id_t target_prop;
  vm_val_t *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  uint caller_ofs;
  CVmRun *in_stack_ffffffffffffff38;
  vm_rcdesc *in_stack_ffffffffffffff50;
  vm_val_t local_40;
  undefined8 local_30;
  vm_val_t *local_28;
  undefined8 local_20;
  char *local_18;
  undefined8 *local_10;
  
  argc = (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  target_prop = (vm_prop_id_t)((ulong)in_stack_ffffffffffffff20 >> 0x30);
  caller_ofs = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff18 = in_XMM1_Qa;
    in_stack_ffffffffffffff28 = in_XMM2_Qa;
    in_stack_ffffffffffffff38 = in_XMM3_Qa;
    in_stack_ffffffffffffff50 = in_XMM4_Qb;
    argc = (uint)((ulong)in_XMM0_Qb >> 0x20);
    target_prop = (vm_prop_id_t)((ulong)in_XMM1_Qb >> 0x30);
    caller_ofs = (uint)((ulong)in_XMM2_Qb >> 0x20);
  }
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = (char *)in_RSI;
  local_10 = in_RDI;
  vm_val_t::set_obj(&local_40,G_predef_X.reflection_services);
  if ((local_40.val.obj != 0) && (G_predef_X.reflection_valToSymbol != 0)) {
    CVmStack::push(local_28);
    in_stack_fffffffffffffec8 = (vm_val_t *)0x0;
    CVmRun::get_prop(in_stack_ffffffffffffff38,caller_ofs,in_stack_ffffffffffffff28,target_prop,
                     in_stack_ffffffffffffff18,argc,in_stack_ffffffffffffff50);
    CVmRun::get_r0();
    pcVar1 = vm_val_t::get_as_string(in_stack_fffffffffffffec8);
    if (pcVar1 != (char *)0x0) {
      pvVar2 = CVmRun::get_r0();
      *local_10 = *(undefined8 *)pvVar2;
      *(anon_union_8_8_cb74652f_for_val *)(local_10 + 1) = pvVar2->val;
      return pcVar1;
    }
  }
  t3vsprintf((char *)val,(size_t)fmt,(char *)refl.val.ptr,(__va_list_tag *)refl._0_8_);
  local_18 = alloc_str_buf(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0);
  t3vsprintf((char *)val,(size_t)fmt,(char *)refl.val.ptr,(__va_list_tag *)refl._0_8_);
  vmb_put_len(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
  return local_18;
}

Assistant:

const char *CVmObjString::reflect_to_str(
    VMG_ vm_val_t *new_str, char *result_buf, size_t result_buf_size,
    const vm_val_t *val, const char *fmt, ...)
{
    /* look for an exported reflectionServices object from the byteocde */
    vm_val_t refl;
    refl.set_obj(G_predef->reflection_services);
    vm_prop_id_t valToSym = G_predef->reflection_valToSymbol;
    if (refl.val.obj != VM_INVALID_OBJ && valToSym != VM_INVALID_PROP)
    {
        /* invoke reflectionServices.valToSymbol(val) */
        G_stk->push(val);
        G_interpreter->get_prop(vmg_ 0, &refl, valToSym, &refl, 1, 0);

        /* if we got a string, return it */
        const char *str = G_interpreter->get_r0()->get_as_string(vmg0_);
        if (str != 0)
        {
            /* set the return value */
            *new_str = *G_interpreter->get_r0();
            
            /* return the string buffer */
            return str;
        }
    }

    /* 
     *   No reflection services - fall back on the boilerplate format.  Start
     *   by calculating the amount of space we need for the formatted string,
     *   adding a byte for the trailing null.
     */
    va_list args;
    va_start(args, fmt);
    size_t need = t3vsprintf(0, 0, fmt, args) + 1;
    va_end(args);

    /* allocate space, including room for the length prefix */
    result_buf = alloc_str_buf(
        vmg_ new_str, result_buf, result_buf_size, need + VMB_LEN);

    /* do the formatting */
    va_start(args, fmt);
    t3vsprintf(result_buf + VMB_LEN, need, fmt, args);
    va_end(args);

    /* set the length prefix */
    vmb_put_len(result_buf, need);

    /* return the buffer */
    return result_buf;
}